

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void reset_source(vw *all,size_t numbits)

{
  io_buf *buf;
  io_buf *piVar1;
  parser *ppVar2;
  parser *ppVar3;
  _Map_pointer pppeVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  code *pcVar8;
  ostream *os;
  int *piVar9;
  char *pcVar10;
  vw_exception *pvVar11;
  code *pcVar12;
  ulong uVar13;
  int f;
  socklen_t size;
  sockaddr_in client_address;
  stringstream __msg;
  int local_228 [2];
  string local_220;
  string local_200;
  string local_1e0;
  sockaddr local_1c0;
  unique_lock<std::mutex> local_1b0;
  ostream local_1a0;
  
  buf = all->p->input;
  buf->current = 0;
  if (all->p->write_cache == true) {
    (*all->p->output->_vptr_io_buf[7])();
    all->p->write_cache = false;
    (*all->p->output->_vptr_io_buf[8])();
    remove((all->p->output->finalname)._begin);
    piVar1 = all->p->output;
    iVar6 = rename((piVar1->currentname)._begin,(piVar1->finalname)._begin);
    if (iVar6 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a0,"WARN: reset_source(vw& all, size_t numbits) cannot rename: ",0x3b);
      os = operator<<(&local_1a0,&all->p->output->currentname);
      std::__ostream_insert<char,std::char_traits<char>>(os," to ",4);
      operator<<(os,&all->p->output->finalname);
      pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar11,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x8c,&local_1e0);
      __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar6 = (*buf->_vptr_io_buf[4])(buf);
    if (CONCAT44(extraout_var,iVar6) != 0) {
      do {
        iVar6 = (*buf->_vptr_io_buf[9])(buf);
        if ((char)iVar6 == '\0') {
          piVar9 = (buf->files)._end;
          (buf->files)._end = piVar9 + -1;
          local_1b0._M_device = (mutex_type *)CONCAT44(local_1b0._M_device._4_4_,piVar9[-1]);
          piVar9 = std::__find_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((all->final_prediction_sink)._begin,(all->final_prediction_sink)._end,
                              &local_1b0);
          if (piVar9 == (all->final_prediction_sink)._end) {
            io_buf::close_file_or_socket((int)local_1b0._M_device);
          }
        }
        else {
          (*buf->_vptr_io_buf[8])(buf);
        }
        iVar6 = (*buf->_vptr_io_buf[4])(buf);
      } while (CONCAT44(extraout_var_00,iVar6) != 0);
    }
    (**buf->_vptr_io_buf)(buf,(all->p->output->finalname)._begin,(ulong)all->stdin_off,1);
    all->p->reader = read_cached_features;
  }
  if (all->p->resettable == true) {
    if (all->daemon == false) {
      piVar9 = (buf->files)._begin;
      if ((buf->files)._end != piVar9) {
        uVar13 = 0;
        do {
          (*buf->_vptr_io_buf[1])(buf,(ulong)(uint)piVar9[uVar13]);
          uVar7 = cache_numbits(buf,(buf->files)._begin[uVar13]);
          if (uVar7 < numbits) {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&local_1a0,"argh, a bug in caching of some sort!",0x24);
            pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar11,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                       ,0xc9,&local_220);
            __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          uVar13 = uVar13 + 1;
          piVar9 = (buf->files)._begin;
        } while (uVar13 < (ulong)((long)(buf->files)._end - (long)piVar9 >> 2));
      }
    }
    else {
      local_1b0._M_device = &all->p->output_lock;
      local_1b0._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_1b0);
      local_1b0._M_owns = true;
      ppVar2 = all->p;
      while (ppVar3 = all->p,
            pppeVar4 = (ppVar3->ready_parsed_examples).object_queue.c.
                       super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node,
            ((long)(ppVar3->ready_parsed_examples).object_queue.c.
                   super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last -
             (long)(ppVar3->ready_parsed_examples).object_queue.c.
                   super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur >> 3) +
            ((long)(ppVar3->ready_parsed_examples).object_queue.c.
                   super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(ppVar3->ready_parsed_examples).object_queue.c.
                   super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 3) +
            ((((ulong)((long)pppeVar4 -
                      (long)(ppVar3->ready_parsed_examples).object_queue.c.
                            super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(pppeVar4 == (_Map_pointer)0x0)) * 0x40 != 0) {
        std::condition_variable::wait((unique_lock *)&ppVar2->output_done);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_1b0);
      io_buf::close_file_or_socket(*(all->p->input->files)._begin);
      v_array<int>::clear(&all->final_prediction_sink);
      v_array<int>::clear(&all->p->input->files);
      local_228[1] = 0x10;
      local_228[0] = accept(all->p->bound_sock,&local_1c0,(socklen_t *)(local_228 + 1));
      if (local_228[0] < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"accept: ",8);
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        std::operator<<(&local_1a0,pcVar10);
        pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar11,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0xb1,&local_200);
        __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1b0._M_device = (mutex_type *)CONCAT44(local_1b0._M_device._4_4_,local_228[0]);
      v_array<int>::push_back(&all->final_prediction_sink,(int *)&local_1b0);
      v_array<int>::push_back(&all->p->input->files,local_228);
      bVar5 = isbinary(all->p->input);
      pcVar12 = read_features_string;
      if (bVar5) {
        pcVar12 = read_cached_features;
      }
      pcVar8 = print_result;
      if (bVar5) {
        pcVar8 = binary_print_result;
      }
      all->p->reader = pcVar12;
      all->print = pcVar8;
    }
  }
  return;
}

Assistant:

void reset_source(vw& all, size_t numbits)
{
  io_buf* input = all.p->input;
  input->current = 0;
  if (all.p->write_cache)
  {
    all.p->output->flush();
    all.p->write_cache = false;
    all.p->output->close_file();
    remove(all.p->output->finalname.begin());

    if (0 != rename(all.p->output->currentname.begin(), all.p->output->finalname.begin()))
      THROW("WARN: reset_source(vw& all, size_t numbits) cannot rename: " << all.p->output->currentname << " to "
                                                                          << all.p->output->finalname);

    while (input->num_files() > 0)
      if (input->compressed())
        input->close_file();
      else
      {
        int fd = input->files.pop();
        const auto& fps = all.final_prediction_sink;

        // If the current popped file is not in the list of final predictions sinks, close it.
        if(std::find(fps.cbegin(), fps.cend(), fd) == fps.cend())
          io_buf::close_file_or_socket(fd);
      }
    input->open_file(all.p->output->finalname.begin(), all.stdin_off, io_buf::READ);  // pushing is merged into
                                                                                      // open_file
    all.p->reader = read_cached_features;
  }
  if (all.p->resettable == true)
  {
    if (all.daemon)
    {
      // wait for all predictions to be sent back to client
      {
        std::unique_lock<std::mutex> lock(all.p->output_lock);
        all.p->output_done.wait(lock, [&] { return all.p->ready_parsed_examples.size() == 0; });
      }

      // close socket, erase final prediction sink and socket
      io_buf::close_file_or_socket(all.p->input->files[0]);
      all.final_prediction_sink.clear();
      all.p->input->files.clear();

      sockaddr_in client_address;
      socklen_t size = sizeof(client_address);
      int f = (int)accept(all.p->bound_sock, (sockaddr*)&client_address, &size);
      if (f < 0)
        THROW("accept: " << strerror(errno));

      // note: breaking cluster parallel online learning by dropping support for id

      all.final_prediction_sink.push_back((size_t)f);
      all.p->input->files.push_back(f);

      if (isbinary(*(all.p->input)))
      {
        all.p->reader = read_cached_features;
        all.print = binary_print_result;
      }
      else
      {
        all.p->reader = read_features_string;
        all.print = print_result;
      }
    }
    else
    {
      for (size_t i = 0; i < input->files.size(); i++)
      {
        input->reset_file(input->files[i]);
        if (cache_numbits(input, input->files[i]) < numbits)
          THROW("argh, a bug in caching of some sort!");
      }
    }
  }
}